

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_bang.c
# Opt level: O0

void * bng_new(t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_bng *x_00;
  _glist *p_Var2;
  _clock *p_Var3;
  t_float tVar4;
  double dVar5;
  int local_8c;
  undefined1 local_78 [8];
  t_iemgui_drawfunctions w;
  int fthold;
  int ftbreak;
  int fs;
  int ldy;
  int ldx;
  int a;
  t_bng *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  x_00 = (t_bng *)iemgui_new(bng_class);
  p_Var2 = canvas_getcurrent();
  iVar1 = sys_zoomfontheight(p_Var2->gl_font,1,0);
  ldy = iVar1 + 5;
  fs = 0;
  p_Var2 = canvas_getcurrent();
  iVar1 = sys_zoomfontheight(p_Var2->gl_font,1,0);
  ftbreak = (int)((double)((iVar1 + 5) * -8) / 15.0);
  fthold = (x_00->x_gui).x_fontsize;
  w.draw_move._4_4_ = 0x32;
  w.draw_move._0_4_ = 0xfa;
  local_78 = (undefined1  [8])bng_draw_new;
  w.draw_new = bng_draw_config;
  w.draw_config = (t_iemdrawfunptr)0x0;
  w.draw_iolets = bng_draw_update;
  w.draw_update = bng_draw_select;
  w.draw_select = (t_iemdrawfunptr)0x0;
  w.draw_erase = (t_iemdrawfunptr)0x0;
  iemgui_setdrawfunctions((t_iemgui *)x_00,(t_iemgui_drawfunctions *)local_78);
  if (((((((argc == 0xe) && (argv->a_type == A_FLOAT)) && (argv[1].a_type == A_FLOAT)) &&
        (((argv[2].a_type == A_FLOAT && (argv[3].a_type == A_FLOAT)) &&
         ((argv[4].a_type == A_SYMBOL || (argv[4].a_type == A_FLOAT)))))) &&
       ((argv[5].a_type == A_SYMBOL || (argv[5].a_type == A_FLOAT)))) &&
      ((argv[6].a_type == A_SYMBOL || (argv[6].a_type == A_FLOAT)))) &&
     ((((argv[7].a_type == A_FLOAT && (argv[8].a_type == A_FLOAT)) && (argv[9].a_type == A_FLOAT))
      && (argv[10].a_type == A_FLOAT)))) {
    tVar4 = atom_getfloatarg(0,0xe,argv);
    ldy = (int)tVar4;
    tVar4 = atom_getfloatarg(1,0xe,argv);
    w.draw_move._0_4_ = (int)tVar4;
    tVar4 = atom_getfloatarg(2,0xe,argv);
    w.draw_move._4_4_ = (int)tVar4;
    tVar4 = atom_getfloatarg(3,0xe,argv);
    iem_inttosymargs(&(x_00->x_gui).x_isa,(int)tVar4);
    iemgui_new_getnames((t_iemgui *)x_00,4,argv);
    tVar4 = atom_getfloatarg(7,0xe,argv);
    fs = (int)tVar4;
    tVar4 = atom_getfloatarg(8,0xe,argv);
    ftbreak = (int)tVar4;
    tVar4 = atom_getfloatarg(9,0xe,argv);
    iem_inttofstyle(&(x_00->x_gui).x_fsf,(int)tVar4);
    tVar4 = atom_getfloatarg(10,0xe,argv);
    fthold = (int)tVar4;
    iemgui_all_loadcolors((t_iemgui *)x_00,argv + 0xb,argv + 0xc,argv + 0xd);
  }
  else {
    iemgui_new_getnames((t_iemgui *)x_00,4,(t_atom *)0x0);
  }
  (x_00->x_gui).x_fsf =
       (t_iem_fstyle_flags)
       ((uint)(x_00->x_gui).x_fsf & 0xffffff7f | (uint)((x_00->x_gui).x_snd != (t_symbol *)0x0) << 7
       );
  (x_00->x_gui).x_fsf =
       (t_iem_fstyle_flags)
       ((uint)(x_00->x_gui).x_fsf & 0xffffffbf | (uint)((x_00->x_gui).x_rcv != (t_symbol *)0x0) << 6
       );
  x_00->x_flashed = 0;
  if (((uint)(x_00->x_gui).x_fsf & 0x3f) == 1) {
    strcpy((x_00->x_gui).x_font,"helvetica");
  }
  else if (((uint)(x_00->x_gui).x_fsf & 0x3f) == 2) {
    strcpy((x_00->x_gui).x_font,"times");
  }
  else {
    (x_00->x_gui).x_fsf = (t_iem_fstyle_flags)((uint)(x_00->x_gui).x_fsf & 0xffffffc0);
    strcpy((x_00->x_gui).x_font,sys_font);
  }
  if (((uint)(x_00->x_gui).x_fsf >> 6 & 1) != 0) {
    pd_bind((t_pd *)x_00,(x_00->x_gui).x_rcv);
  }
  (x_00->x_gui).x_ldx = fs;
  (x_00->x_gui).x_ldy = ftbreak;
  if (fthold < 4) {
    local_8c = 4;
  }
  else {
    local_8c = fthold;
  }
  (x_00->x_gui).x_fontsize = local_8c;
  iVar1 = iemgui_clip_size(ldy);
  (x_00->x_gui).x_w = iVar1;
  (x_00->x_gui).x_h = (x_00->x_gui).x_w;
  bng_check_minmax(x_00,w.draw_move._4_4_,(int)w.draw_move);
  (x_00->x_gui).x_isa = (t_iem_init_symargs)((uint)(x_00->x_gui).x_isa & 0xf7ffffff);
  iemgui_verify_snd_ne_rcv((t_iemgui *)x_00);
  dVar5 = clock_getsystime();
  x_00->x_lastflashtime = dVar5;
  p_Var3 = clock_new(x_00,bng_tick_hld);
  x_00->x_clock_hld = p_Var3;
  p_Var3 = clock_new(x_00,bng_tick_lck);
  x_00->x_clock_lck = p_Var3;
  iemgui_newzoom((t_iemgui *)x_00);
  outlet_new((t_object *)x_00,&s_bang);
  return x_00;
}

Assistant:

static void *bng_new(t_symbol *s, int argc, t_atom *argv)
{
    t_bng *x = (t_bng *)iemgui_new(bng_class);
    int a = IEM_GUI_DEFAULTSIZE;
    int ldx = 0, ldy = -8 * IEM_GUI_DEFAULTSIZE_SCALE;
    int fs = x->x_gui.x_fontsize;
    int ftbreak = IEM_BNG_DEFAULTBREAKFLASHTIME,
        fthold = IEM_BNG_DEFAULTHOLDFLASHTIME;

    IEMGUI_SETDRAWFUNCTIONS(x, bng);

    if((argc == 14)&&IS_A_FLOAT(argv,0)
       &&IS_A_FLOAT(argv,1)&&IS_A_FLOAT(argv,2)
       &&IS_A_FLOAT(argv,3)
       &&(IS_A_SYMBOL(argv,4)||IS_A_FLOAT(argv,4))
       &&(IS_A_SYMBOL(argv,5)||IS_A_FLOAT(argv,5))
       &&(IS_A_SYMBOL(argv,6)||IS_A_FLOAT(argv,6))
       &&IS_A_FLOAT(argv,7)&&IS_A_FLOAT(argv,8)
       &&IS_A_FLOAT(argv,9)&&IS_A_FLOAT(argv,10))
    {
        a = (int)atom_getfloatarg(0, argc, argv);
        fthold = (int)atom_getfloatarg(1, argc, argv);
        ftbreak = (int)atom_getfloatarg(2, argc, argv);
        iem_inttosymargs(&x->x_gui.x_isa, atom_getfloatarg(3, argc, argv));
        iemgui_new_getnames(&x->x_gui, 4, argv);
        ldx = (int)atom_getfloatarg(7, argc, argv);
        ldy = (int)atom_getfloatarg(8, argc, argv);
        iem_inttofstyle(&x->x_gui.x_fsf, atom_getfloatarg(9, argc, argv));
        fs = (int)atom_getfloatarg(10, argc, argv);
        iemgui_all_loadcolors(&x->x_gui, argv+11, argv+12, argv+13);
    }
    else iemgui_new_getnames(&x->x_gui, 4, 0);

    x->x_gui.x_fsf.x_snd_able = (0 != x->x_gui.x_snd);
    x->x_gui.x_fsf.x_rcv_able = (0 != x->x_gui.x_rcv);
    x->x_flashed = 0;
    if(x->x_gui.x_fsf.x_font_style == 1) strcpy(x->x_gui.x_font, "helvetica");
    else if(x->x_gui.x_fsf.x_font_style == 2) strcpy(x->x_gui.x_font, "times");
    else { x->x_gui.x_fsf.x_font_style = 0;
        strcpy(x->x_gui.x_font, sys_font); }

    if (x->x_gui.x_fsf.x_rcv_able)
        pd_bind(&x->x_gui.x_obj.ob_pd, x->x_gui.x_rcv);
    x->x_gui.x_ldx = ldx;
    x->x_gui.x_ldy = ldy;

    x->x_gui.x_fontsize = (fs < 4)?4:fs;
    x->x_gui.x_w = iemgui_clip_size(a);
    x->x_gui.x_h = x->x_gui.x_w;
    bng_check_minmax(x, ftbreak, fthold);
    x->x_gui.x_isa.x_locked = 0;
    iemgui_verify_snd_ne_rcv(&x->x_gui);
    x->x_lastflashtime = clock_getsystime();
    x->x_clock_hld = clock_new(x, (t_method)bng_tick_hld);
    x->x_clock_lck = clock_new(x, (t_method)bng_tick_lck);
    iemgui_newzoom(&x->x_gui);
    outlet_new(&x->x_gui.x_obj, &s_bang);
    return (x);
}